

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_colored_printf_(int color,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined4 in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *col_str;
  int n;
  char buffer [256];
  va_list args;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  char *local_138;
  int local_12c;
  char local_128 [255];
  undefined1 local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined4 local_8;
  int local_4;
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  local_18 = local_1e8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_EDI;
  vsnprintf(local_128,0x100,in_RSI,&local_28);
  local_29 = 0;
  if (acutest_colorize_ == 0) {
    local_4 = printf("%s",local_128);
  }
  else {
    switch(local_8) {
    case 1:
      local_138 = "\x1b[0;31m";
      break;
    case 2:
      local_138 = "\x1b[0;32m";
      break;
    case 3:
      local_138 = "\x1b[0;33m";
      break;
    default:
      local_138 = "\x1b[0m";
      break;
    case 10:
      local_138 = "\x1b[1m";
      break;
    case 0xb:
      local_138 = "\x1b[1;31m";
      break;
    case 0xc:
      local_138 = "\x1b[1;32m";
      break;
    case 0xd:
      local_138 = "\x1b[1;33m";
    }
    printf("%s",local_138);
    local_12c = printf("%s",local_128);
    printf("\x1b[0m");
    local_4 = local_12c;
  }
  return local_4;
}

Assistant:

acutest_colored_printf_(int color, const char* fmt, ...)
{
    va_list args;
    char buffer[256];
    int n;

    va_start(args, fmt);
    vsnprintf(buffer, sizeof(buffer), fmt, args);
    va_end(args);
    buffer[sizeof(buffer)-1] = '\0';

    if(!acutest_colorize_) {
        return printf("%s", buffer);
    }

#if defined ACUTEST_UNIX_
    {
        const char* col_str;
        switch(color) {
            case ACUTEST_COLOR_RED_:                col_str = "\033[0;31m"; break;
            case ACUTEST_COLOR_GREEN_:              col_str = "\033[0;32m"; break;
            case ACUTEST_COLOR_YELLOW_:             col_str = "\033[0;33m"; break;
            case ACUTEST_COLOR_RED_INTENSIVE_:      col_str = "\033[1;31m"; break;
            case ACUTEST_COLOR_GREEN_INTENSIVE_:    col_str = "\033[1;32m"; break;
            case ACUTEST_COLOR_YELLOW_INTENSIVE_:   col_str = "\033[1;33m"; break;
            case ACUTEST_COLOR_DEFAULT_INTENSIVE_:  col_str = "\033[1m"; break;
            default:                                col_str = "\033[0m"; break;
        }
        printf("%s", col_str);
        n = printf("%s", buffer);
        printf("\033[0m");
        return n;
    }
#elif defined ACUTEST_WIN_
    {
        HANDLE h;
        CONSOLE_SCREEN_BUFFER_INFO info;
        WORD attr;

        h = GetStdHandle(STD_OUTPUT_HANDLE);
        GetConsoleScreenBufferInfo(h, &info);

        switch(color) {
            case ACUTEST_COLOR_RED_:                attr = FOREGROUND_RED; break;
            case ACUTEST_COLOR_GREEN_:              attr = FOREGROUND_GREEN; break;
            case ACUTEST_COLOR_YELLOW_:             attr = FOREGROUND_RED | FOREGROUND_GREEN; break;
            case ACUTEST_COLOR_RED_INTENSIVE_:      attr = FOREGROUND_RED | FOREGROUND_INTENSITY; break;
            case ACUTEST_COLOR_GREEN_INTENSIVE_:    attr = FOREGROUND_GREEN | FOREGROUND_INTENSITY; break;
            case ACUTEST_COLOR_DEFAULT_INTENSIVE_:  attr = FOREGROUND_BLUE | FOREGROUND_GREEN | FOREGROUND_RED | FOREGROUND_INTENSITY; break;
            case ACUTEST_COLOR_YELLOW_INTENSIVE_:   attr = FOREGROUND_RED | FOREGROUND_GREEN | FOREGROUND_INTENSITY; break;
            default:                                attr = 0; break;
        }
        if(attr != 0)
            SetConsoleTextAttribute(h, attr);
        n = printf("%s", buffer);
        SetConsoleTextAttribute(h, info.wAttributes);
        return n;
    }
#else
    n = printf("%s", buffer);
    return n;
#endif
}